

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

void __thiscall
QRhiGles2::registerUniformIfActive
          (QRhiGles2 *this,BlockVariable *var,QByteArray *namePrefix,int binding,int baseOffset,
          GLuint program,ActiveUniformLocationTracker *activeUniformLocations,
          QGles2UniformDescriptionVector *dst)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<int,_true,_true>,_bool> pVar4;
  QByteArray local_88;
  undefined1 local_70 [12];
  int iStack_64;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (var->type == Struct) {
    registerUniformIfActive((QRhiGles2 *)var);
  }
  else {
    stack0xffffffffffffff98 = (BlockVariable *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_70._0_4_ = var->type;
    local_58._0_8_ = namePrefix;
    local_58._8_8_ = var;
    QStringBuilder<const_QByteArray_&,_const_QByteArray_&>::convertTo<QByteArray>
              (&local_88,(QStringBuilder<const_QByteArray_&,_const_QByteArray_&> *)local_58);
    pcVar3 = local_88.d.ptr;
    if (local_88.d.ptr == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    local_70._4_4_ =
         (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
           functions[0x5e])((ulong)program,pcVar3);
    if (-1 < (int)local_70._4_4_) {
      local_58._0_8_ =
           &(activeUniformLocations->set)._M_h.
            super__Hashtable_alloc<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<int,_true>_>_>
      ;
      pVar4 = std::
              _Hashtable<int,int,std::pmr::polymorphic_allocator<int>,std::__detail::_Identity,std::equal_to<int>,QDuplicateTracker<int,32ul>::QHasher<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<int_const&,std::__detail::_AllocNode<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<int,true>>>>
                        ((_Hashtable<int,int,std::pmr::polymorphic_allocator<int>,std::__detail::_Identity,std::equal_to<int>,QDuplicateTracker<int,32ul>::QHasher<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&activeUniformLocations->set,local_70 + 4);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar1 = (var->arrayDims).d.size;
        if (uVar1 < 2) {
          stack0xffffffffffffff98 = (BlockVariable *)CONCAT44(baseOffset + var->offset,binding);
          if (uVar1 == 0) {
            iVar2 = 0;
          }
          else {
            iVar2 = *(var->arrayDims).d.ptr;
          }
          uStack_60 = (undefined1 *)CONCAT44(iVar2,var->size);
          if ((dst->super_QVLABase<QGles2UniformDescription>).super_QVLABaseBase.s ==
              (dst->super_QVLABase<QGles2UniformDescription>).super_QVLABaseBase.a) {
            local_48 = uStack_60;
            local_58._0_8_ = CONCAT44(local_70._4_4_,local_70._0_4_);
            local_58._8_8_ = stack0xffffffffffffff98;
            QVLABase<QGles2UniformDescription>::emplace_back_impl<QGles2UniformDescription>
                      (&dst->super_QVLABase<QGles2UniformDescription>,8,
                       &dst->super_QVLAStorage<24UL,_4UL,_8LL>,(QGles2UniformDescription *)local_58)
            ;
          }
          else {
            QVLABase<QGles2UniformDescription>::emplace_back_impl<QGles2UniformDescription_const&>
                      (&dst->super_QVLABase<QGles2UniformDescription>,8,
                       &dst->super_QVLAStorage<24UL,_4UL,_8LL>,(QGles2UniformDescription *)local_70)
            ;
          }
        }
        else {
          registerUniformIfActive((QRhiGles2 *)var);
        }
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiGles2::registerUniformIfActive(const QShaderDescription::BlockVariable &var,
                                        const QByteArray &namePrefix,
                                        int binding,
                                        int baseOffset,
                                        GLuint program,
                                        ActiveUniformLocationTracker *activeUniformLocations,
                                        QGles2UniformDescriptionVector *dst)
{
    if (var.type == QShaderDescription::Struct) {
        qWarning("Nested structs are not supported at the moment. '%s' ignored.",
                 var.name.constData());
        return;
    }
    QGles2UniformDescription uniform;
    uniform.type = var.type;
    const QByteArray name = namePrefix + var.name;
    // Here we expect that the OpenGL implementation has proper active uniform
    // handling, meaning that a uniform that is declared but not accessed
    // elsewhere in the code is reported as -1 when querying the location. If
    // that is not the case, it won't break anything, but we'll generate
    // unnecessary glUniform* calls then.
    uniform.glslLocation = f->glGetUniformLocation(program, name.constData());
    if (uniform.glslLocation >= 0 && !activeUniformLocations->hasSeen(uniform.glslLocation)) {
        if (var.arrayDims.size() > 1) {
            qWarning("Array '%s' has more than one dimension. This is not supported.",
                     var.name.constData());
            return;
        }
        uniform.binding = binding;
        uniform.offset = uint(baseOffset + var.offset);
        uniform.size = var.size;
        uniform.arrayDim = var.arrayDims.isEmpty() ? 0 : var.arrayDims.first();
        dst->append(uniform);
    }
}